

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  TestInfo *pTVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  string *psVar7;
  TestInfo *in_RDX;
  TestInfo *in_RDI;
  string detail;
  string summary;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  string kTestcase;
  TestResult *result;
  TestInfo *in_stack_fffffffffffffb58;
  TestPartResult *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  TestResult *in_stack_fffffffffffffb70;
  ostream *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  char *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  allocator<char> *paVar8;
  TestResult *in_stack_fffffffffffffc28;
  string *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  ostream *in_stack_fffffffffffffc50;
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  TimeInMillis in_stack_fffffffffffffcf8;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  TestPartResult *local_260;
  int local_258;
  int local_254;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [32];
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  undefined1 local_119 [40];
  undefined1 local_f1 [40];
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  TestResult *local_20;
  TestInfo *local_18;
  TestInfo *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = TestInfo::result(in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  std::allocator<char>::~allocator(&local_41);
  std::operator<<((ostream *)local_8,"    <testcase");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  TestInfo::name((TestInfo *)0x11fffa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  pcVar6 = TestInfo::value_param(in_stack_fffffffffffffb58);
  if (pcVar6 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    in_stack_fffffffffffffc50 = (ostream *)TestInfo::value_param(in_stack_fffffffffffffb58);
    in_stack_fffffffffffffc48 = (string *)local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40
                       ,in_stack_fffffffffffffc38);
    std::__cxx11::string::~string((string *)(local_f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  psVar7 = (string *)TestInfo::type_param(in_stack_fffffffffffffb58);
  if (psVar7 != (string *)0x0) {
    in_stack_fffffffffffffc38 = (string *)local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    in_stack_fffffffffffffc28 = (TestResult *)TestInfo::type_param(in_stack_fffffffffffffb58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,psVar7,
                       in_stack_fffffffffffffc38);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::~string((string *)(local_119 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_119);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  bVar2 = TestInfo::should_run(local_18);
  pcVar6 = "notrun";
  if (bVar2) {
    pcVar6 = "run";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,psVar7,
                     in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  paVar8 = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  TestResult::elapsed_time(local_20);
  FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffcf8);
  OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,psVar7,
                     in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
  OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,psVar7,
                     in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  pTVar1 = local_8;
  TestPropertiesAsXmlAttributes_abi_cxx11_(in_stack_fffffffffffffc28);
  std::operator<<((ostream *)pTVar1,local_250);
  std::__cxx11::string::~string(local_250);
  local_254 = 0;
  for (local_258 = 0; iVar5 = local_258,
      iVar4 = TestResult::total_part_count((TestResult *)0x1207bb), iVar5 < iVar4;
      local_258 = local_258 + 1) {
    local_260 = TestResult::GetTestPartResult
                          (in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20)
                          );
    uVar3 = TestPartResult::failed(local_260);
    if ((bool)uVar3) {
      local_254 = local_254 + 1;
      if (local_254 == 1) {
        std::operator<<((ostream *)local_8,">\n");
      }
      psVar7 = (string *)TestPartResult::file_name(in_stack_fffffffffffffb60);
      iVar5 = TestPartResult::line_number(local_260);
      FormatCompilerIndependentFileLocation_abi_cxx11_(pcVar6,(int)((ulong)paVar8 >> 0x20));
      std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb88 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           TestPartResult::summary((TestPartResult *)0x120a4a);
      std::operator+(in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_2c0);
      in_stack_fffffffffffffb80 = std::operator<<((ostream *)local_8,"      <failure message=\"");
      in_stack_fffffffffffffb70 = (TestResult *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar3,in_stack_fffffffffffffba0),(char *)psVar7,
                 (allocator<char> *)CONCAT44(iVar5,in_stack_fffffffffffffb90));
      EscapeXmlAttribute(&in_stack_fffffffffffffb58->test_case_name_);
      in_stack_fffffffffffffb68 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(in_stack_fffffffffffffb80,local_2e0);
      std::operator<<((ostream *)in_stack_fffffffffffffb68,"\" type=\"\">");
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcff);
      std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb60 =
           (TestPartResult *)TestPartResult::message((TestPartResult *)0x120b67);
      std::operator+(in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_348);
      in_stack_fffffffffffffb58 = local_8;
      RemoveInvalidXmlCharacters(psVar7);
      std::__cxx11::string::c_str();
      OutputXmlCDataSection((ostream *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
      std::__cxx11::string::~string(local_368);
      std::operator<<((ostream *)local_8,"</failure>\n");
      std::__cxx11::string::~string(local_328);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_280);
    }
  }
  if (local_254 == 0) {
    std::operator<<((ostream *)local_8," />\n");
  }
  else {
    std::operator<<((ostream *)local_8,"    </testcase>\n");
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);
  *stream << TestPropertiesAsXmlAttributes(result);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}